

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O0

void helper_sve2_pmull_h_aarch64(void *vd,void *vn,void *vm,uint32_t desc)

{
  int32_t iVar1;
  intptr_t iVar2;
  uint64_t uVar3;
  byte bVar4;
  uint64_t mm;
  uint64_t nn;
  uint64_t *m;
  uint64_t *n;
  uint64_t *d;
  intptr_t opr_sz;
  intptr_t i;
  int shift;
  uint32_t desc_local;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  iVar1 = simd_data(desc);
  iVar2 = simd_oprsz(desc);
  for (opr_sz = 0; opr_sz < iVar2 / 8; opr_sz = opr_sz + 1) {
    bVar4 = (byte)(iVar1 << 3);
    uVar3 = pmull_h(*(ulong *)((long)vn + opr_sz * 8) >> (bVar4 & 0x3f) & 0xff00ff00ff00ff,
                    *(ulong *)((long)vm + opr_sz * 8) >> (bVar4 & 0x3f) & 0xff00ff00ff00ff);
    *(uint64_t *)((long)vd + opr_sz * 8) = uVar3;
  }
  return;
}

Assistant:

void HELPER(sve2_pmull_h)(void *vd, void *vn, void *vm, uint32_t desc)
{
    int shift = simd_data(desc) * 8;
    intptr_t i, opr_sz = simd_oprsz(desc);
    uint64_t *d = vd, *n = vn, *m = vm;

    for (i = 0; i < opr_sz / 8; ++i) {
        uint64_t nn = (n[i] >> shift) & 0x00ff00ff00ff00ffull;
        uint64_t mm = (m[i] >> shift) & 0x00ff00ff00ff00ffull;

        d[i] = pmull_h(nn, mm);
    }
}